

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O2

void dlib::tt::scale_rows(tensor *out,tensor *m,tensor *v)

{
  uint *puVar1;
  bool bVar2;
  ostream *poVar3;
  fatal_error *pfVar4;
  string local_1d0;
  ostringstream dlib_o_out;
  uint auStack_198 [88];
  ostringstream *local_38;
  string *local_30;
  
  bVar2 = have_same_dimensions(out,m);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x73);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::tt::scale_rows(tensor &, const tensor &, const tensor &)");
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"have_same_dimensions(out,m)");
    std::operator<<(poVar3,".\n");
    puVar1 = (uint *)((long)auStack_198 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar3 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar3,"\n");
    pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&local_1d0);
    __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
  }
  bVar2 = is_vector(v);
  if (bVar2) {
    if (m->m_size == 0) {
      if (v->m_size != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x77);
        std::operator<<(poVar3,".\n");
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
                                );
        std::operator<<(poVar3,".\n");
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
        poVar3 = std::operator<<(poVar3,
                                 "void dlib::tt::scale_rows(tensor &, const tensor &, const tensor &)"
                                );
        std::operator<<(poVar3,".\n\n");
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
        poVar3 = std::operator<<(poVar3,"m.size() != 0");
        std::operator<<(poVar3,".\n");
        puVar1 = (uint *)((long)auStack_198 + *(long *)(_dlib_o_out + -0x18));
        *puVar1 = *puVar1 | 1;
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"");
        std::operator<<(poVar3,"\n");
        pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::stringbuf::str();
        fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&local_1d0);
        __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
      }
    }
    else {
      if (m->m_n != v->m_size) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x78);
        std::operator<<(poVar3,".\n");
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
                                );
        std::operator<<(poVar3,".\n");
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
        poVar3 = std::operator<<(poVar3,
                                 "void dlib::tt::scale_rows(tensor &, const tensor &, const tensor &)"
                                );
        std::operator<<(poVar3,".\n\n");
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
        poVar3 = std::operator<<(poVar3,"m.num_samples() == static_cast<long long>(v.size())");
        std::operator<<(poVar3,".\n");
        puVar1 = (uint *)((long)auStack_198 + *(long *)(_dlib_o_out + -0x18));
        *puVar1 = *puVar1 | 1;
        poVar3 = std::operator<<((ostream *)&dlib_o_out,"");
        std::operator<<(poVar3,"\n");
        pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::stringbuf::str();
        fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&local_1d0);
        __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
      }
      mat((matrix_op<dlib::op_pointer_to_mat<float>_> *)&dlib_o_out,m);
      mat((matrix_op<dlib::op_pointer_to_mat<float>_> *)&local_1d0,v);
      local_38 = &dlib_o_out;
      local_30 = &local_1d0;
      tensor::operator=(out,(matrix_exp<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                             *)&local_38);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x74);
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
                          );
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar3 = std::operator<<(poVar3,
                           "void dlib::tt::scale_rows(tensor &, const tensor &, const tensor &)");
  std::operator<<(poVar3,".\n\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar3 = std::operator<<(poVar3,"is_vector(v)");
  std::operator<<(poVar3,".\n");
  puVar1 = (uint *)((long)auStack_198 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar3,"\n");
  pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&local_1d0);
  __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
}

Assistant:

void scale_rows (
        tensor& out,
        const tensor& m,
        const tensor& v
    )
    {
        DLIB_CASSERT(have_same_dimensions(out,m));
        DLIB_CASSERT(is_vector(v));
        if (m.size() == 0 && v.size() == 0)
            return;
        DLIB_CASSERT(m.size() != 0);
        DLIB_CASSERT(m.num_samples() == static_cast<long long>(v.size()));

#ifdef DLIB_USE_CUDA
        cuda::scale_rows(out, m, v);
#else
        out = scale_rows(mat(m), mat(v));
#endif
    }